

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc16.cpp
# Opt level: O3

void __thiscall ot::commissioner::Crc16::Update(Crc16 *this,uint8_t aByte)

{
  char cVar1;
  uint uVar2;
  
  uVar2 = (uint)(ushort)((ushort)aByte << 8 ^ this->mCrc);
  cVar1 = -8;
  do {
    uVar2 = (int)(short)uVar2 >> 0xf & (uint)this->mPolynomial ^ uVar2 * 2;
    cVar1 = cVar1 + '\x01';
  } while (cVar1 != '\0');
  this->mCrc = (uint16_t)uVar2;
  return;
}

Assistant:

void Crc16::Update(uint8_t aByte)
{
    uint8_t i;

    mCrc = mCrc ^ static_cast<uint16_t>(aByte << 8);
    i    = 8;

    do
    {
        if (mCrc & 0x8000)
        {
            mCrc = static_cast<uint16_t>(mCrc << 1) ^ mPolynomial;
        }
        else
        {
            mCrc = static_cast<uint16_t>(mCrc << 1);
        }
    } while (--i);
}